

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * soul::Value::createFloatVectorArray(InterleavedView<float> data)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  Value *in_RDI;
  ulong uVar4;
  float *in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  PrimitiveType local_64;
  Type local_60;
  InterleavedView<float> local_48;
  Type local_30;
  
  local_64.type = float32;
  Type::createVector(&local_60,&local_64,(ulong)in_stack_00000018);
  Type::createArray(&local_30,&local_60,(ulong)in_stack_0000001c);
  Value(in_RDI,&local_30);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_60.structure.object);
  getData((PackedData *)&local_60,in_RDI);
  PackedData::getAsChannelSet32(&local_48,(PackedData *)&local_60);
  if ((in_stack_00000018 == local_48.size.numChannels) &&
     (in_stack_0000001c == local_48.size.numFrames)) {
    if (in_stack_00000018 != 0) {
      uVar4 = 0;
      uVar1 = in_stack_0000001c;
      pfVar3 = local_48.data.data;
      pfVar2 = in_stack_00000008;
      do {
        for (; uVar1 != 0; uVar1 = uVar1 - 1) {
          *local_48.data.data = *in_stack_00000008;
          local_48.data.data = local_48.data.data + local_48.data.stride;
          in_stack_00000008 = in_stack_00000008 + in_stack_00000010;
        }
        uVar4 = uVar4 + 1;
        local_48.data.data = pfVar3 + 1;
        in_stack_00000008 = pfVar2 + 1;
        uVar1 = in_stack_0000001c;
        pfVar3 = local_48.data.data;
        pfVar2 = in_stack_00000008;
      } while (uVar4 != in_stack_00000018);
    }
    return in_RDI;
  }
  throwInternalCompilerError("size == dest.getSize()","copy",0x2e1);
}

Assistant:

Value Value::createFloatVectorArray (choc::buffer::InterleavedView<float> data)
{
    Value v (Type::createVector (PrimitiveType::float32, data.getNumChannels()).createArray (data.getNumFrames()));
    copy (v.getAsChannelSet32(), data);
    return v;
}